

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O3

int __thiscall
EventDispatcherHelper::addEventListener
          (EventDispatcherHelper *this,IEventListener *listener,int event_id)

{
  Node *pNVar1;
  Node *pNVar2;
  EventListenerNode *pEVar3;
  Node *pNVar4;
  AutoLock _auto_lock_;
  AutoLock AStack_38;
  
  AutoLock::AutoLock(&AStack_38,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                     ,0x66);
  pEVar3 = (EventListenerNode *)
           operator_new(0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                        ,0x68);
  pEVar3->mListener = listener;
  pEVar3->mEventId = event_id;
  pNVar4 = (Node *)operator_new(0x18,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                ,0xa7);
  pNVar4->val = pEVar3;
  pNVar1 = (this->mEventList).mTail;
  pNVar2 = pNVar1->prev;
  pNVar4->prev = pNVar2;
  pNVar4->next = pNVar1;
  pNVar2->next = pNVar4;
  pNVar1->prev = pNVar4;
  AutoLock::~AutoLock(&AStack_38);
  return 0;
}

Assistant:

int EventDispatcherHelper::addEventListener( IEventListener *listener, int event_id )
{
	DebugAutoLock( mLock );
	
	EventListenerNode *node = jh_new EventListenerNode;
	
	node->mListener = listener;
	node->mEventId = event_id;
	
	mEventList.push_back( node );

	return 0;
}